

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O2

int N_VInvTest_SensWrapper(N_Vector x,N_Vector z)

{
  int iVar1;
  int no_zero_found;
  int iVar2;
  int i;
  long lVar3;
  
  iVar2 = 1;
  for (lVar3 = 0; lVar3 < (int)*(long *)((long)x->content + 8); lVar3 = lVar3 + 1) {
    iVar1 = N_VInvTest(*(N_Vector *)(*x->content + lVar3 * 8),*(N_Vector *)(*z->content + lVar3 * 8)
                      );
    if (iVar1 != 1) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

booleantype N_VInvTest_SensWrapper(N_Vector x, N_Vector z)
{
  int i;
  booleantype no_zero_found, tmp;

  no_zero_found = SUNTRUE;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VInvTest(NV_VEC_SW(x,i), NV_VEC_SW(z,i));
    if (tmp != SUNTRUE) no_zero_found = SUNFALSE;
  }

  return(no_zero_found);
}